

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nap_comm.cpp
# Opt level: O1

void __thiscall RandomCommTest_TestsInTests_Test::TestBody(RandomCommTest_TestsInTests_Test *this)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  mapped_type mVar6;
  int *piVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  NAPComm *pNVar10;
  topo_data *mpi_comm;
  undefined4 uVar11;
  undefined4 uVar12;
  int *piVar13;
  undefined8 uVar14;
  undefined8 orig_procs;
  bool bVar15;
  uint uVar16;
  value_type_conflict2 *__val_1;
  NAPComm *this_00;
  long lVar17;
  vector<int,_std::allocator<int>_> *pvVar18;
  mapped_type *pmVar19;
  void *pvVar20;
  long lVar21;
  long lVar22;
  value_type_conflict *__val;
  int iVar23;
  comm_data *pcVar24;
  ulong uVar25;
  topo_data *ptVar26;
  MPIX_Data *pMVar27;
  char *pcVar28;
  long lVar29;
  comm_data *pcVar30;
  MPIX_Data *pMVar31;
  NAPComm *nap_comm;
  pointer piVar32;
  size_type sVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  int node;
  int rank;
  vector<double,_std::allocator<double>_> send_d_vals;
  int local_rank;
  int num_procs_2;
  vector<double,_std::allocator<double>_> std_recv_d_vals;
  vector<double,_std::allocator<double>_> nap_recv_d_vals;
  vector<int,_std::allocator<int>_> nap_recv_vals;
  vector<int,_std::allocator<int>_> std_recv_vals;
  int rank_2;
  vector<int,_std::allocator<int>_> send_vals;
  vector<int,_std::allocator<int>_> recv_node_to_local;
  vector<int,_std::allocator<int>_> recv_nodes;
  NAPData nap_data;
  vector<int,_std::allocator<int>_> send_idx_nodes;
  vector<int,_std::allocator<int>_> global_send_idx;
  int num_procs;
  int num_procs_1;
  int rank_1;
  int local_num_procs;
  MPIX_Data recv_data;
  vector<int,_std::allocator<int>_> global_recv_idx;
  MPIX_Data send_data;
  pointer in_stack_fffffffffffffc78;
  undefined1 uVar37;
  undefined8 in_stack_fffffffffffffc80;
  comm_data *pcVar38;
  topo_data *abs_error;
  undefined4 uVar39;
  undefined4 in_stack_fffffffffffffc9c;
  int in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  int local_354;
  NAPComm *local_350;
  int local_348;
  allocator_type local_341;
  topo_data *local_340;
  vector<double,_std::allocator<double>_> local_338;
  ulong local_318;
  int local_310;
  int local_30c;
  undefined1 local_308 [16];
  MPI_Comm local_2f8;
  void *local_2f0;
  vector<double,_std::allocator<double>_> local_2e8;
  vector<int,_std::allocator<int>_> local_2c8;
  comm_data *local_2b0;
  ulong local_2a8;
  vector<int,_std::allocator<int>_> local_2a0;
  int local_284;
  value_type_conflict local_280;
  int local_27c;
  undefined1 local_278 [8];
  _Rb_tree_node_base _Stack_270;
  size_t local_250;
  undefined1 local_248 [16];
  MPI_Comm local_238;
  vector<int,_std::allocator<int>_> local_228;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_208;
  long local_1d0;
  int *local_1c8;
  int *local_1c0;
  long local_1b8;
  int *local_1b0;
  vector<int,_std::allocator<int>_> local_1a8;
  long local_188;
  size_type local_180;
  pointer local_178;
  vector<int,_std::allocator<int>_> local_170;
  undefined1 local_158 [4];
  undefined1 local_154 [4];
  undefined1 local_150 [4];
  undefined1 local_14c [4];
  undefined1 local_148 [24];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  pointer local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  undefined1 local_b0 [24];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  pointer local_38;
  
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_348);
  MPI_Comm_size(&ompi_mpi_comm_world,local_158);
  setenv("PPN","4",1);
  local_38 = (pointer)0x0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_b0._8_16_ = (undefined1  [16])0x0;
  local_d0 = (pointer)0x0;
  local_e0 = (undefined1  [16])0x0;
  local_f0 = (undefined1  [16])0x0;
  local_100 = (undefined1  [16])0x0;
  local_110 = (undefined1  [16])0x0;
  local_120 = (undefined1  [16])0x0;
  local_130 = (undefined1  [16])0x0;
  local_148._8_16_ = (undefined1  [16])0x0;
  form_initial_communicator(10000,(MPIX_Data *)local_b0,(MPIX_Data *)local_148);
  iVar23 = local_348 * 10000;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_170,(long)(int)local_b0._4_4_,(allocator_type *)&local_208);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_c8,(long)(int)local_148._4_4_,(allocator_type *)&local_208);
  for (lVar17 = 0; lVar17 < (int)local_b0._0_4_; lVar17 = lVar17 + 1) {
    iVar3 = *(pointer)(local_b0._8_8_ + lVar17 * 4);
    iVar4 = *(int *)(local_98._8_8_ + lVar17 * 4);
    iVar5 = *(int *)(local_98._8_8_ + (lVar17 + 1) * 4);
    if (iVar4 < iVar5) {
      lVar29 = (long)iVar4;
      do {
        local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar29] = *(int *)(local_78._0_8_ + lVar29 * 4) + iVar23;
        lVar29 = lVar29 + 1;
      } while (iVar5 != lVar29);
    }
    in_stack_fffffffffffffc78 = (pointer)(local_68._8_8_ + lVar17 * 8);
    MPI_Isend(local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + iVar4,iVar5 - iVar4,&ompi_mpi_int,iVar3,0x72aa,
              &ompi_mpi_comm_world,in_stack_fffffffffffffc78);
  }
  lVar29 = 0;
  lVar17 = 0;
  while( true ) {
    uVar39 = (undefined4)((ulong)in_stack_fffffffffffffc78 >> 0x20);
    uVar37 = (undefined1)in_stack_fffffffffffffc80;
    if ((int)local_148._0_4_ <= lVar29) break;
    piVar32 = (pointer)(local_148._8_8_ + lVar29 * 4);
    piVar1 = (int *)(local_130._8_8_ + lVar29 * 4);
    lVar21 = lVar29 + 1;
    lVar29 = lVar29 + 1;
    in_stack_fffffffffffffc78 = (pointer)(lVar17 + local_100._8_8_);
    MPI_Irecv(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start + *piVar1,*(int *)(local_130._8_8_ + lVar21 * 4) - *piVar1,&ompi_mpi_int,
              *piVar32,0x72aa,&ompi_mpi_comm_world,in_stack_fffffffffffffc78);
    lVar17 = lVar17 + 8;
  }
  if (local_b0._0_4_ != 0) {
    MPI_Waitall(local_b0._0_4_,local_68._8_8_,0);
  }
  if (local_148._0_4_ != 0) {
    MPI_Waitall(local_148._0_4_,local_100._8_8_,0);
  }
  piVar32 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  local_1b8 = (long)(int)local_b0._0_4_;
  orig_procs = local_b0._8_8_;
  local_1c0 = (int *)local_98._8_8_;
  local_178 = (pointer)local_78._0_8_;
  local_350 = (NAPComm *)local_148._8_8_;
  uVar14 = local_130._8_8_;
  local_1b0 = local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  MPI_Comm_rank(&ompi_mpi_comm_world,local_150);
  MPI_Comm_size(&ompi_mpi_comm_world,local_154);
  local_340 = (topo_data *)operator_new(0x18);
  topo_data::topo_data(local_340,(MPI_Comm)&ompi_mpi_comm_world);
  this_00 = (NAPComm *)operator_new(0x40);
  local_1c8 = (int *)uVar14;
  NAPComm::NAPComm(this_00,local_340);
  piVar1 = local_1c0;
  local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2f8 = (MPI_Comm)0x0;
  local_308 = (undefined1  [16])0x0;
  iVar23 = (int)local_1b8;
  map_procs_to_nodes(this_00,iVar23,(int *)orig_procs,local_1c0,
                     (vector<int,_std::allocator<int>_> *)&local_338,
                     (vector<int,_std::allocator<int>_> *)local_308,(MPI_Comm)CONCAT44(uVar39,1),
                     (bool)uVar37);
  mpi_comm = local_340;
  local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pcVar30 = this_00->local_S_comm->send_data;
  pcVar24 = this_00->local_S_comm->recv_data;
  pcVar38 = this_00->local_L_comm->send_data;
  ptVar26 = (topo_data *)local_308;
  form_local_comm(iVar23,(int *)orig_procs,piVar1,local_1b0,
                  (vector<int,_std::allocator<int>_> *)ptVar26,pcVar30,pcVar24,pcVar38,
                  (vector<int,_std::allocator<int>_> *)&local_2e8,(MPI_Comm)local_340,
                  (topo_data *)CONCAT44(in_stack_fffffffffffffc9c,0x4c1b),in_stack_fffffffffffffca0)
  ;
  uVar37 = SUB81(pcVar38,0);
  form_global_comm(this_00->local_S_comm->recv_data,this_00->global_comm->send_data,
                   (vector<int,_std::allocator<int>_> *)&local_2e8,(MPI_Comm)mpi_comm,ptVar26,
                   (int)pcVar30);
  piVar1 = local_1c8;
  pNVar10 = local_350;
  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_238 = (MPI_Comm)0x0;
  local_248 = (undefined1  [16])0x0;
  map_procs_to_nodes(this_00,local_148._0_4_,(int *)local_350,local_1c8,&local_228,
                     (vector<int,_std::allocator<int>_> *)local_248,
                     (MPI_Comm)((ulong)pcVar24 & 0xffffffff00000000),(bool)uVar37);
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pcVar30 = this_00->local_R_comm->send_data;
  pcVar24 = this_00->local_R_comm->recv_data;
  pcVar38 = this_00->local_L_comm->recv_data;
  uVar39 = 0x7d30;
  ptVar26 = (topo_data *)local_248;
  abs_error = mpi_comm;
  form_local_comm(local_148._0_4_,(int *)pNVar10,piVar1,piVar32,
                  (vector<int,_std::allocator<int>_> *)ptVar26,pcVar24,pcVar30,pcVar38,&local_1a8,
                  (MPI_Comm)mpi_comm,(topo_data *)CONCAT44(in_stack_fffffffffffffc9c,0x7d30),
                  in_stack_fffffffffffffca0);
  form_global_comm(this_00->local_R_comm->send_data,this_00->global_comm->recv_data,&local_1a8,
                   (MPI_Comm)mpi_comm,ptVar26,(int)pcVar24);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_27c);
  MPI_Comm_size(&ompi_mpi_comm_world,&local_30c);
  MPI_Comm_rank(mpi_comm->local_comm,&local_310);
  MPI_Comm_size(mpi_comm->local_comm,local_14c);
  sVar33 = (size_type)mpi_comm->num_nodes;
  local_318 = (ulong)(uint)this_00->global_comm->send_data->num_msgs;
  uVar16 = this_00->global_comm->recv_data->num_msgs;
  local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_278,sVar33,(value_type_conflict *)&local_2a0
             ,(allocator_type *)&local_2c8);
  local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_2a0,sVar33,(value_type_conflict *)&local_2c8,(allocator_type *)&local_280);
  iVar23 = uVar16 + (int)local_318;
  local_284 = iVar23;
  local_188 = (long)(int)local_148._0_4_;
  local_180 = sVar33;
  if (iVar23 == 0) {
    local_2f0 = (void *)0x0;
    local_2b0 = (comm_data *)0x0;
  }
  else {
    uVar25 = (long)iVar23 * 8;
    if (iVar23 < 0) {
      uVar25 = 0xffffffffffffffff;
    }
    local_2b0 = (comm_data *)operator_new__(uVar25);
    uVar25 = (long)iVar23 * 4;
    if (iVar23 < 0) {
      uVar25 = 0xffffffffffffffff;
    }
    local_2f0 = operator_new__(uVar25);
  }
  local_280 = 0;
  local_350 = this_00;
  local_2a8 = (ulong)uVar16;
  std::vector<int,_std::allocator<int>_>::vector(&local_2c8,(long)local_30c,&local_280,&local_341);
  if (0 < (int)local_318) {
    lVar17 = local_318 * 4;
    lVar29 = 0;
    pcVar24 = local_2b0;
    do {
      local_354 = *(int *)((long)local_350->global_comm->send_data->procs + lVar29);
      lVar21 = (long)local_340->ppn * (long)local_354 + (long)local_310;
      piVar1 = (int *)(CONCAT44(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      *(int *)((long)local_2f0 + lVar29) = local_350->topo_info->rank_node;
      pcVar30 = pcVar24;
      MPI_Isend((long)local_2f0 + lVar29,1,&ompi_mpi_int,lVar21,0x1ea8c34,&ompi_mpi_comm_world);
      lVar29 = lVar29 + 4;
      pcVar24 = (comm_data *)&pcVar24->procs;
    } while (lVar17 - lVar29 != 0);
  }
  pvVar20 = local_2f0;
  lVar17 = (long)(int)local_318;
  local_1d0 = lVar17;
  if (0 < (int)local_2a8) {
    lVar29 = local_2a8 * 4;
    pcVar24 = (comm_data *)(&local_2b0->num_msgs + lVar17 * 2);
    lVar21 = 0;
    do {
      local_354 = *(int *)((long)local_350->global_comm->recv_data->procs + lVar21);
      lVar22 = (long)local_340->ppn * (long)local_354 + (long)local_310;
      piVar1 = (int *)(CONCAT44(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) + lVar22 * 4);
      *piVar1 = *piVar1 + 1;
      *(int *)((long)pvVar20 + lVar21 + lVar17 * 4) = local_350->topo_info->rank_node;
      pcVar30 = pcVar24;
      MPI_Isend((long)pvVar20 + lVar21 + lVar17 * 4,1,&ompi_mpi_int,lVar22,0x31f7ce2,
                &ompi_mpi_comm_world);
      lVar21 = lVar21 + 4;
      pcVar24 = (comm_data *)&pcVar24->procs;
    } while (lVar29 - lVar21 != 0);
  }
  MPI_Allreduce(1,CONCAT44(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_),local_30c,&ompi_mpi_int,
                &ompi_mpi_op_sum,&ompi_mpi_comm_world);
  iVar23 = *(int *)(CONCAT44(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_) + (long)local_27c * 4);
  if (0 < iVar23) {
    do {
      pcVar30 = (comm_data *)&local_208;
      MPI_Probe(0xffffffff,0xffffffff,&ompi_mpi_comm_world,pcVar30);
      uVar11 = local_208._M_impl._0_4_;
      uVar12 = local_208._M_impl._4_4_;
      MPI_Recv(&local_354,1,&ompi_mpi_int,local_208._M_impl._0_4_,local_208._M_impl._4_4_,
               &ompi_mpi_comm_world);
      pvVar18 = (vector<int,_std::allocator<int>_> *)local_278;
      if (uVar12 == 0x1ea8c34) {
        pvVar18 = &local_2a0;
      }
      (pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[local_354] = uVar11;
      iVar23 = iVar23 + -1;
    } while (iVar23 != 0);
  }
  sVar33 = local_180;
  pcVar24 = local_2b0;
  ptVar26 = local_340;
  if (local_284 != 0) {
    MPI_Waitall(local_284,local_2b0,0);
  }
  MPI_Allreduce(1,local_278,sVar33 & 0xffffffff,&ompi_mpi_int,&ompi_mpi_op_max,ptVar26->local_comm);
  MPI_Allreduce(1,CONCAT44(local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_),sVar33 & 0xffffffff,&ompi_mpi_int
                ,&ompi_mpi_op_max,ptVar26->local_comm);
  lVar17 = local_1b8;
  piVar13 = local_1c0;
  piVar1 = local_1c8;
  if (0 < (int)local_318) {
    piVar7 = local_350->global_comm->send_data->procs;
    lVar29 = 0;
    do {
      local_354 = piVar7[lVar29];
      piVar7[lVar29] = *(int *)((long)local_278 + (long)local_354 * 4);
      lVar29 = lVar29 + 1;
    } while (local_1d0 != lVar29);
  }
  if (0 < (int)local_2a8) {
    piVar7 = local_350->global_comm->recv_data->procs;
    uVar25 = 0;
    do {
      local_354 = piVar7[uVar25];
      piVar7[uVar25] =
           *(int *)(CONCAT44(local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_) + (long)local_354 * 4);
      uVar25 = uVar25 + 1;
    } while (local_2a8 != uVar25);
  }
  if (pcVar24 != (comm_data *)0x0) {
    operator_delete__(pcVar24);
  }
  if (local_2f0 != (void *)0x0) {
    operator_delete__(local_2f0);
  }
  if ((void *)CONCAT44(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_4_));
  }
  if (local_278 != (undefined1  [8])0x0) {
    operator_delete((void *)local_278);
  }
  iVar23 = piVar13[lVar17];
  uVar16 = piVar1[local_188];
  local_208._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_208._M_impl.super__Rb_tree_header._M_header;
  local_208._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_208._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_208._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_270._M_left = (_Base_ptr)(local_278 + 8);
  _Stack_270._M_color = 0;
  _Stack_270._M_parent = (_Base_ptr)0x0;
  local_250 = 0;
  _Stack_270._M_right = _Stack_270._M_left;
  local_208._M_impl.super__Rb_tree_header._M_header._M_right =
       local_208._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (long)iVar23) {
    lVar17 = 0;
    do {
      mVar6 = *(mapped_type *)((long)local_178 + lVar17);
      pmVar19 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&local_208,(key_type *)((long)local_1b0 + lVar17));
      *pmVar19 = mVar6;
      lVar17 = lVar17 + 4;
    } while ((long)iVar23 * 4 != lVar17);
  }
  pNVar10 = local_350;
  if (0 < (int)uVar16) {
    uVar25 = 0;
    do {
      pmVar19 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)local_278,piVar32);
      *pmVar19 = (mapped_type)uVar25;
      uVar25 = uVar25 + 1;
      piVar32 = piVar32 + 1;
    } while (uVar16 != uVar25);
  }
  comm_data::remove_duplicates(pNVar10->global_comm->send_data);
  comm_data::remove_duplicates(pNVar10->global_comm->recv_data);
  comm_data::remove_duplicates(pNVar10->local_S_comm->send_data);
  comm_data::remove_duplicates(pNVar10->local_S_comm->recv_data);
  comm_data::remove_duplicates(pNVar10->local_R_comm->send_data);
  comm_data::remove_duplicates(pNVar10->local_R_comm->recv_data);
  map_indices(pNVar10->global_comm->send_data,pNVar10->local_S_comm->recv_data);
  map_indices(pNVar10->local_R_comm->send_data,pNVar10->global_comm->recv_data);
  map_indices(pNVar10->local_S_comm->send_data,
              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              &local_208);
  map_indices(pNVar10->local_L_comm->send_data,
              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              &local_208);
  map_indices(pNVar10->local_R_comm->recv_data,
              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              local_278);
  map_indices(pNVar10->local_L_comm->recv_data,
              (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
              local_278);
  piVar1 = pNVar10->local_S_comm->recv_data->indices;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  piVar1 = pNVar10->global_comm->recv_data->indices;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  pNVar10->local_S_comm->recv_data->indices = (int *)0x0;
  pNVar10->global_comm->recv_data->indices = (int *)0x0;
  NAPComm::finalize(pNVar10);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_278);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_208);
  if ((AssertHelperData *)
      local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (AssertHelperData *)0x0) {
    operator_delete(local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_308._0_8_);
  }
  if (local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _local_278 = (undefined1  [16])0x0;
  _Stack_270._M_parent = (_Base_ptr)0x0;
  pvVar20 = operator_new(40000);
  _Stack_270._0_8_ = pvVar20;
  local_278 = (undefined1  [8])pvVar20;
  lVar17 = 0;
  _Stack_270._M_parent = (_Base_ptr)((long)pvVar20 + 40000);
  memset(pvVar20,0,40000);
  _Stack_270._0_8_ = (_Base_ptr)((long)pvVar20 + 40000);
  uVar16 = local_348 * 10000;
  uVar34 = uVar16 | 1;
  uVar35 = uVar16 | 2;
  uVar36 = uVar16 | 3;
  do {
    puVar2 = (uint *)((long)pvVar20 + lVar17 * 4);
    *puVar2 = uVar16;
    puVar2[1] = uVar34;
    puVar2[2] = uVar35;
    puVar2[3] = uVar36;
    lVar17 = lVar17 + 4;
    uVar16 = uVar16 + 4;
    uVar34 = uVar34 + 4;
    uVar35 = uVar35 + 4;
    uVar36 = uVar36 + 4;
  } while (lVar17 != 10000);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_2a0,(long)(int)local_148._4_4_,(allocator_type *)&local_208);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_2c8,(long)(int)local_148._4_4_,(allocator_type *)&local_208);
  iVar23 = 0x153418;
  pMVar27 = (MPIX_Data *)local_b0;
  pMVar31 = (MPIX_Data *)local_148;
  standard_communication<int>
            ((vector<int,_std::allocator<int>_> *)local_278,&local_2a0,0xc0c1,
             (MPI_Datatype)&ompi_mpi_int,pMVar27,pMVar31);
  local_208._M_impl._0_16_ = (undefined1  [16])0x0;
  MPIX_INAPsend((void *)local_278,pNVar10,(MPI_Datatype)&local_208,iVar23,(MPI_Comm)pMVar27,
                (NAPData *)pMVar31);
  MPIX_INAPrecv((void *)CONCAT44(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_4_),pNVar10,
                (MPI_Datatype)&local_208,iVar23,(MPI_Comm)pMVar27,(NAPData *)pMVar31);
  MPIX_NAPwait(pNVar10,(NAPData *)&local_208);
  if (0 < (int)local_148._4_4_) {
    lVar17 = 0;
    lVar29 = 0;
    do {
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_338,"std_recv_vals[i]","nap_recv_vals[i]",
                 (int *)(CONCAT44(local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_) + lVar17),
                 (int *)(CONCAT44(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_) + lVar17));
      if (local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)local_308);
        if (local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish == (pointer)0x0) {
          pcVar28 = "";
        }
        else {
          pcVar28 = (char *)*local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_2e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/bienz2[P]Streamline/tests/test_nap_comm.cpp"
                   ,0xfd,pcVar28);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)local_308);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_308._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar15 = testing::internal::IsTrue(true);
          if ((bVar15) &&
             ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_308._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)((long)*(double *)local_308._0_8_ + 8))();
          }
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_308._8_8_;
          local_308 = auVar8 << 0x40;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        goto LAB_0011c83b;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar29 = lVar29 + 1;
      lVar17 = lVar17 + 4;
    } while (lVar29 < (int)local_148._4_4_);
  }
  local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar20 = operator_new(80000);
  local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)pvVar20;
  local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)pvVar20;
  lVar17 = 0;
  local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)((long)pvVar20 + 80000);
  memset(pvVar20,0,80000);
  local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((long)pvVar20 + 80000);
  uVar16 = local_348 * 10000;
  uVar34 = uVar16 | 1;
  uVar35 = uVar16 | 2;
  uVar36 = uVar16 | 3;
  do {
    puVar2 = (uint *)((long)local_278 + lVar17 * 4);
    *puVar2 = uVar16;
    puVar2[1] = uVar34;
    puVar2[2] = uVar35;
    puVar2[3] = uVar36;
    lVar17 = lVar17 + 4;
    uVar16 = uVar16 + 4;
    uVar34 = uVar34 + 4;
    uVar35 = uVar35 + 4;
    uVar36 = uVar36 + 4;
  } while (lVar17 != 10000);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_308,(long)(int)local_148._4_4_,
             (allocator_type *)&local_2e8);
  pNVar10 = local_350;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_2e8,(long)(int)local_148._4_4_,(allocator_type *)&local_228);
  iVar23 = 0x153418;
  pMVar27 = (MPIX_Data *)local_b0;
  pMVar31 = (MPIX_Data *)local_148;
  standard_communication<double>
            (&local_338,(vector<double,_std::allocator<double>_> *)local_308,0xc0c1,
             (MPI_Datatype)&ompi_mpi_int,pMVar27,pMVar31);
  MPIX_INAPsend(local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,pNVar10,(MPI_Datatype)&local_208,iVar23,
                (MPI_Comm)pMVar27,(NAPData *)pMVar31);
  MPIX_INAPrecv(local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,pNVar10,(MPI_Datatype)&local_208,iVar23,
                (MPI_Comm)pMVar27,(NAPData *)pMVar31);
  MPIX_NAPwait(pNVar10,(NAPData *)&local_208);
  if (0 < (int)local_148._4_4_) {
    lVar17 = 0;
    do {
      testing::internal::DoubleNearPredFormat
                ((char *)pcVar38,(char *)pcVar30,(char *)0x11c634,
                 (double)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 (double)CONCAT44(in_stack_fffffffffffffc9c,uVar39),(double)abs_error);
      if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start._0_1_ == (allocator_type)0x0) {
        testing::Message::Message((Message *)local_248);
        if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish == (pointer)0x0) {
          pcVar28 = "";
        }
        else {
          pcVar28 = *(char **)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/bienz2[P]Streamline/tests/test_nap_comm.cpp"
                   ,0x114,pcVar28);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)local_248);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_248._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar15 = testing::internal::IsTrue(true);
          if ((bVar15) &&
             ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_248._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_248._0_8_ + 8))();
          }
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_248._8_8_;
          local_248 = auVar9 << 0x40;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        goto LAB_0011c808;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar17 = lVar17 + 1;
    } while (lVar17 < (int)local_148._4_4_);
  }
  pNVar10 = local_350;
  ptVar26 = local_350->topo_info;
  if (ptVar26 != (topo_data *)0x0) {
    MPI_Comm_free(&ptVar26->local_comm);
    operator_delete(ptVar26);
  }
  NAPComm::~NAPComm(pNVar10);
  operator_delete(pNVar10);
  setenv("PPN","16",1);
LAB_0011c808:
  if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_308._0_8_);
  }
  if (local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_0011c83b:
  if ((void *)CONCAT44(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_4_));
  }
  if (local_278 != (undefined1  [8])0x0) {
    operator_delete((void *)local_278);
  }
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_e0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e0._0_8_);
  }
  if ((pointer)local_100._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_100._8_8_);
  }
  if ((pointer)local_110._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._0_8_);
  }
  if ((pointer)local_130._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_130._8_8_);
  }
  if ((pointer)local_148._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._8_8_);
  }
  if ((pointer)local_48._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_48._0_8_);
  }
  if ((pointer)local_68._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._8_8_);
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  if ((pointer)local_98._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._8_8_);
  }
  if ((pointer)local_b0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_b0._8_8_);
  }
  return;
}

Assistant:

TEST(RandomCommTest, TestsInTests)
{
    // Get MPI Information
    int rank, num_procs;
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    MPI_Comm_size(MPI_COMM_WORLD, &num_procs);

    setenv("PPN", "4", 1);

    // Initial communication info (standard)
    int local_size = 10000; // Number of variables each rank stores
    MPIX_Data send_data;
    MPIX_Data recv_data;
    form_initial_communicator(local_size, &send_data, &recv_data);

    // Determine unique global indices (map from send indices to recv indicies)
    int first = local_size * rank;
    std::vector<int> global_send_idx(send_data.size_msgs);
    std::vector<int> global_recv_idx(recv_data.size_msgs);
    int tag = 29354;
    for (int i = 0; i < send_data.num_msgs; i++)
    {
        int proc = send_data.procs[i];
        int start = send_data.indptr[i];
        int end = send_data.indptr[i+1];
        for (int j = start; j < end; j++)
        {
            int idx = send_data.indices[j];
            global_send_idx[j] = first + idx;
        }
        MPI_Isend(&global_send_idx[start], end - start, MPI_INT, proc,
                tag, MPI_COMM_WORLD, &send_data.requests[i]);
    }
    for (int i = 0; i < recv_data.num_msgs; i++)
    {
        int proc = recv_data.procs[i];
        int start = recv_data.indptr[i];
        int end = recv_data.indptr[i+1];
        MPI_Irecv(&global_recv_idx[start], end - start, MPI_INT, proc,
                tag, MPI_COMM_WORLD, &recv_data.requests[i]);
    }
    if (send_data.num_msgs) MPI_Waitall(send_data.num_msgs, 
            send_data.requests.data(), MPI_STATUSES_IGNORE);
    if (recv_data.num_msgs) MPI_Waitall(recv_data.num_msgs, 
            recv_data.requests.data(), MPI_STATUSES_IGNORE);

    // Initializing node-aware communication package
    NAPComm* nap_comm;
    MPIX_NAPinit(send_data.num_msgs, send_data.procs.data(), 
            send_data.indptr.data(), send_data.indices.data(), 
            recv_data.num_msgs, recv_data.procs.data(), 
            recv_data.indptr.data(), global_send_idx.data(),
            global_recv_idx.data(), MPI_COMM_WORLD, &nap_comm);

    // Test correctness of communication
    std::vector<int> send_vals(local_size);
    int val = local_size*rank;
    for (int i = 0; i < local_size; i++)
    {
        send_vals[i] = val++;
    }
    std::vector<int> std_recv_vals(recv_data.size_msgs);
    std::vector<int> nap_recv_vals(recv_data.size_msgs);

    // 1. Standard Communication
    standard_communication(send_vals, std_recv_vals, 49345, MPI_INT, &send_data, &recv_data);

    // 2. Node-Aware Communication
    NAPData nap_data;
    MPIX_INAPsend(send_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_INAPrecv(nap_recv_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_NAPwait(nap_comm, &nap_data);

    // 3. Compare std_recv_vals and nap_recv_vals
    for (int i = 0; i < recv_data.size_msgs; i++)
    {
        ASSERT_EQ(std_recv_vals[i], nap_recv_vals[i]);
    }
    
    std::vector<double> send_d_vals(local_size);
    val = local_size*rank;
    for (int i = 0; i < local_size; i++)
    {
        send_vals[i] = val++;
    }
    std::vector<double> std_recv_d_vals(recv_data.size_msgs);
    std::vector<double> nap_recv_d_vals(recv_data.size_msgs);

    // 1. Standard Communication
    standard_communication(send_d_vals, std_recv_d_vals, 49345, MPI_INT, &send_data, &recv_data);

    // 2. Node-Aware Communication
    MPIX_INAPsend(send_d_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_INAPrecv(nap_recv_d_vals.data(), nap_comm, MPI_INT, 20423, MPI_COMM_WORLD, &nap_data);
    MPIX_NAPwait(nap_comm, &nap_data);

    // 3. Compare std_recv_vals and nap_recv_vals
    for (int i = 0; i < recv_data.size_msgs; i++)
    {
        ASSERT_NEAR(std_recv_d_vals[i], nap_recv_d_vals[i], 1e-10);
    }

    MPIX_NAPDestroy(&nap_comm);

    setenv("PPN", "16", 1);
}